

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walkExpr(Walker *pWalker,Expr *pExpr)

{
  Select *p;
  uint uVar1;
  int iVar2;
  
  uVar1 = (*pWalker->xExprCallback)(pWalker,pExpr);
  if (uVar1 != 0) {
    return uVar1 & 2;
  }
  if ((pExpr->flags & 0x804000) == 0) {
    if ((pExpr->pLeft != (Expr *)0x0) && (iVar2 = walkExpr(pWalker,pExpr->pLeft), iVar2 != 0)) {
      return 2;
    }
    if (pExpr->pRight == (Expr *)0x0) {
      p = (Select *)(pExpr->x).pList;
      if ((pExpr->flags & 0x800) == 0) {
        if (p == (Select *)0x0) {
          return 0;
        }
        iVar2 = sqlite3WalkExprList(pWalker,(ExprList *)p);
      }
      else {
        iVar2 = sqlite3WalkSelect(pWalker,p);
      }
    }
    else {
      iVar2 = walkExpr(pWalker,pExpr->pRight);
    }
    if (iVar2 != 0) {
      return 2;
    }
  }
  return 0;
}

Assistant:

static SQLITE_NOINLINE int walkExpr(Walker *pWalker, Expr *pExpr){
  int rc;
  testcase( ExprHasProperty(pExpr, EP_TokenOnly) );
  testcase( ExprHasProperty(pExpr, EP_Reduced) );
  rc = pWalker->xExprCallback(pWalker, pExpr);
  if( rc ) return rc & WRC_Abort;
  if( !ExprHasProperty(pExpr,(EP_TokenOnly|EP_Leaf)) ){
    if( pExpr->pLeft && walkExpr(pWalker, pExpr->pLeft) ) return WRC_Abort;
    assert( pExpr->x.pList==0 || pExpr->pRight==0 );
    if( pExpr->pRight ){
      if( walkExpr(pWalker, pExpr->pRight) ) return WRC_Abort;
    }else if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      if( sqlite3WalkSelect(pWalker, pExpr->x.pSelect) ) return WRC_Abort;
    }else if( pExpr->x.pList ){
      if( sqlite3WalkExprList(pWalker, pExpr->x.pList) ) return WRC_Abort;
    }
  }
  return WRC_Continue;
}